

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptArray::JoinArrayHelper<Js::JavascriptNativeIntArray>
          (JavascriptNativeIntArray *arr,JavascriptString *separator,ScriptContext *scriptContext)

{
  uint uVar1;
  FinalizableObject FVar2;
  code *pcVar3;
  CharCount initialPointerCapacity;
  bool bVar4;
  charcount_t cVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  JavascriptString *pJVar8;
  CompoundString *left;
  INT_PTR *pIVar9;
  char *pcVar10;
  int iVar11;
  CompoundString *unaff_R12;
  char cVar12;
  uint index;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  Var item;
  
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,arr);
  FVar2.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (arr->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
       super_IRecyclerVisitedObject;
  pIVar9 = &VirtualTableInfo<Js::JavascriptNativeIntArray>::Address;
  if ((FVar2.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
       (IRecyclerVisitedObject)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address) &&
     (pIVar9 = &VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address,
     FVar2.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
     (IRecyclerVisitedObject)
     VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    pcVar10 = 
    "VirtualTableInfo<T>::HasVirtualTable(arr) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(arr)"
    ;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1219,
                                "(VirtualTableInfo<T>::HasVirtualTable(arr) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(arr))"
                                ,
                                "VirtualTableInfo<T>::HasVirtualTable(arr) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(arr)"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    pIVar9 = (INT_PTR *)pcVar10;
  }
  uVar1 = (arr->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length;
  if (uVar1 != 0) {
    if (uVar1 != 1) {
      if (uVar1 == 2) {
        cVar5 = JavascriptString::GetLength(separator);
        if (cVar5 == 0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BVar6 = TemplatedGetItem<Js::JavascriptNativeIntArray>
                            (arr,0,(Var *)&jsReentLock.m_savedNoJsReentrancy,
                             (ScriptContext *)
                             CONCAT71((int7)((ulong)pIVar9 >> 8),jsReentLock.m_arrayObject2._0_1_),
                             false);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          if (BVar6 == 0) {
            left = (CompoundString *)0x0;
          }
          else {
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            left = (CompoundString *)JoinToString((Var)jsReentLock._24_8_,scriptContext);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            *(bool *)((long)local_60 + 0x108) = true;
          }
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pIVar9 = (INT_PTR *)scriptContext;
          BVar6 = TryTemplatedGetItem<Js::JavascriptNativeIntArray,unsigned_int>
                            ((RecyclableObject *)arr,1,(Var *)&jsReentLock.m_savedNoJsReentrancy,
                             scriptContext,true);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          if (BVar6 == 0) {
            cVar12 = (left == (CompoundString *)0x0) * '\b' + '\x01';
            unaff_R12 = left;
          }
          else {
            pIVar9 = (INT_PTR *)
                     CONCAT71((int7)((ulong)pIVar9 >> 8),jsReentLock.m_arrayObject2._0_1_);
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            unaff_R12 = (CompoundString *)JoinToString((Var)jsReentLock._24_8_,scriptContext);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            *(bool *)((long)local_60 + 0x108) = true;
            cVar12 = '\x01';
            if (left != (CompoundString *)0x0) {
              unaff_R12 = (CompoundString *)
                          ConcatString::New((JavascriptString *)left,(JavascriptString *)unaff_R12);
            }
          }
        }
        else {
          cVar12 = '\x05';
        }
        if (cVar12 != '\x05') {
          if (cVar12 != '\t') goto LAB_00bb60a3;
          goto LAB_00bb6093;
        }
      }
      cVar5 = JavascriptString::GetLength(separator);
      iVar11 = uVar1 - 1;
      if (cVar5 == 0) {
        iVar11 = 0;
      }
      initialPointerCapacity = iVar11 + uVar1;
      if (0x7fffff < iVar11 + uVar1) {
        initialPointerCapacity = 0x800000;
      }
      unaff_R12 = CompoundString::NewWithPointerCapacity
                            (initialPointerCapacity,
                             (scriptContext->super_ScriptContextBase).javascriptLibrary);
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar6 = TemplatedGetItem<Js::JavascriptNativeIntArray>
                        (arr,0,(Var *)&jsReentLock.m_savedNoJsReentrancy,
                         (ScriptContext *)
                         CONCAT71((int7)((ulong)pIVar9 >> 8),jsReentLock.m_arrayObject2._0_1_),false
                        );
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      if (BVar6 != 0) {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pJVar8 = JoinToString((Var)jsReentLock._24_8_,scriptContext);
        CompoundString::Append(unaff_R12,pJVar8);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
      }
      if (1 < uVar1) {
        index = 1;
        do {
          if (cVar5 != 0) {
            CompoundString::Append(unaff_R12,separator);
          }
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BVar6 = TryTemplatedGetItem<Js::JavascriptNativeIntArray,unsigned_int>
                            ((RecyclableObject *)arr,index,(Var *)&jsReentLock.m_savedNoJsReentrancy
                             ,scriptContext,true);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          if (BVar6 != 0) {
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            pJVar8 = JoinToString((Var)jsReentLock._24_8_,scriptContext);
            CompoundString::Append(unaff_R12,pJVar8);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            *(bool *)((long)local_60 + 0x108) = true;
          }
          index = index + 1;
        } while (uVar1 != index);
      }
      goto LAB_00bb60a3;
    }
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BVar6 = TemplatedGetItem<Js::JavascriptNativeIntArray>
                      (arr,0,(Var *)&jsReentLock.m_savedNoJsReentrancy,
                       (ScriptContext *)
                       CONCAT71((int7)((ulong)pIVar9 >> 8),jsReentLock.m_arrayObject2._0_1_),false);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    if (BVar6 != 0) {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      unaff_R12 = (CompoundString *)JoinToString((Var)jsReentLock._24_8_,scriptContext);
      goto LAB_00bb60a3;
    }
  }
LAB_00bb6093:
  unaff_R12 = (CompoundString *)
              JavascriptLibrary::GetEmptyString
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
LAB_00bb60a3:
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (JavascriptString *)unaff_R12;
}

Assistant:

JavascriptString* JavascriptArray::JoinArrayHelper(T * arr, JavascriptString* separator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        Assert(VirtualTableInfo<T>::HasVirtualTable(arr) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(arr));
        const uint32 arrLength = arr->length;
        switch(arrLength)
        {
            default:
            {
CaseDefault:
                bool hasSeparator = (separator->GetLength() != 0);
                const charcount_t estimatedAppendCount =
                    min(
                        Join_MaxEstimatedAppendCount,
                        static_cast<charcount_t>(arrLength + (hasSeparator ? arrLength - 1 : 0)));
                CompoundString *const cs =
                    CompoundString::NewWithPointerCapacity(estimatedAppendCount, scriptContext->GetLibrary());
                Var item;
                BOOL gotItem;
                JS_REENTRANT(jsReentLock, gotItem = TemplatedGetItem(arr, 0u, &item, scriptContext));
                if (gotItem)
                {
                    JS_REENTRANT(jsReentLock, cs->Append(JavascriptArray::JoinToString(item, scriptContext)));
                }

                for (uint32 i = 1; i < arrLength; i++)
                {
                    if (hasSeparator)
                    {
                        cs->Append(separator);
                    }

                    JS_REENTRANT(jsReentLock, gotItem = TryTemplatedGetItem<T>(arr, i, &item, scriptContext));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, cs->Append(JavascriptArray::JoinToString(item, scriptContext)));
                    }
                }
                return cs;
            }

            case 2:
            {
                bool hasSeparator = (separator->GetLength() != 0);
                BOOL gotItem;
                if(hasSeparator)
                {
                    goto CaseDefault;
                }

                JavascriptString *res = nullptr;
                Var item;

                JS_REENTRANT(jsReentLock, gotItem = TemplatedGetItem(arr, 0u, &item, scriptContext));
                if (gotItem)
                {
                    JS_REENTRANT(jsReentLock, res = JavascriptArray::JoinToString(item, scriptContext));
                }
                JS_REENTRANT(jsReentLock, gotItem = TryTemplatedGetItem<T>(arr, 1u, &item, scriptContext));
                if (gotItem)
                {
                    JS_REENTRANT(jsReentLock, JavascriptString *const itemString = JavascriptArray::JoinToString(item, scriptContext));
                    return res ? ConcatString::New(res, itemString) : itemString;
                }

                if(res)
                {
                    return res;
                }

                goto Case0;
            }

            case 1:
            {
                Var item;
                BOOL gotItem;
                JS_REENTRANT(jsReentLock, gotItem = TemplatedGetItem(arr, 0u, &item, scriptContext));
                if (gotItem)
                {
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::JoinToString(item, scriptContext));
                }
                // fall through
            }

            case 0:
Case0:
                return scriptContext->GetLibrary()->GetEmptyString();
        }
    }